

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O3

void __thiscall
tiger::trains::ai::LineBlocker::LineBlocker
          (LineBlocker *this,Train *train,GoodType type,BotSharedData *data)

{
  _Rb_tree_header *p_Var1;
  set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *psVar2;
  
  this->train = train;
  this->type = type;
  this->sharedData = data;
  p_Var1 = &(this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header;
  (this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ownBlockLine)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->currentBlock).
  super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->currentBlock).
  super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentBlock).
  super__Vector_base<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = BotSharedData::getBlockLines(data);
  this->blockLines = psVar2;
  return;
}

Assistant:

LineBlocker::LineBlocker(world::Train *train, models::GoodType type, BotSharedData *data)
    : train(train), type(type), sharedData(data)
{
    blockLines = sharedData->getBlockLines();
}